

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDebugger.cpp
# Opt level: O3

void __thiscall moira::Guards::removeAt(Guards *this,u32 addr)

{
  undefined8 *puVar1;
  Guard *pGVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  uVar4 = this->count;
  if (0 < (long)uVar4) {
    lVar5 = 0x18;
    uVar6 = 0;
    do {
      if (*(u32 *)((long)&this->guards[-1].addr + lVar5) == addr) {
        if ((long)(ulong)((int)uVar6 + 1) < (long)uVar4) {
          do {
            pGVar2 = this->guards;
            pGVar2[uVar6 & 0xffffffff].skip = *(long *)((long)&pGVar2->skip + lVar5);
            puVar1 = (undefined8 *)((long)&pGVar2->addr + lVar5);
            uVar3 = *puVar1;
            lVar7 = puVar1[1];
            pGVar2 = pGVar2 + (uVar6 & 0xffffffff);
            pGVar2->addr = (int)uVar3;
            pGVar2->enabled = (bool)(char)((ulong)uVar3 >> 0x20);
            *(int3 *)&pGVar2->field_0x5 = (int3)((ulong)uVar3 >> 0x28);
            pGVar2->hits = lVar7;
            uVar4 = this->count;
            lVar5 = lVar5 + 0x18;
            lVar7 = uVar6 + 2;
            uVar6 = uVar6 + 1;
          } while (lVar7 < (long)uVar4);
        }
        uVar4 = uVar4 - 1;
        this->count = uVar4;
        goto LAB_0024b667;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 != uVar6);
    uVar4 = 1;
  }
LAB_0024b667:
  (*this->_vptr_Guards[2])(this,(ulong)(uVar4 != 0));
  return;
}

Assistant:

void
Guards::removeAt(u32 addr)
{
    for (int i = 0; i < count; i++) {

        if (guards[i].addr == addr) {

            for (int j = i; j + 1 < count; j++) guards[j] = guards[j + 1];
            count--;
            break;
        }
    }
    setNeedsCheck(count != 0);
}